

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_index_tests.cpp
# Opt level: O1

bool blockfilter_index_tests::CheckFilterLookups
               (BlockFilterIndex *filter_index,CBlockIndex *block_index,uint256 *last_header,
               BlockManager *blockman)

{
  long lVar1;
  pointer puVar2;
  undefined8 uVar3;
  pointer puVar4;
  pointer pBVar5;
  pointer pBVar6;
  bool bVar7;
  readonly_property<bool> rVar8;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  pointer pBVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  check_type cVar20;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  undefined1 local_348 [16];
  undefined1 *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  vector<uint256,_std::allocator<uint256>_> filter_hashes;
  vector<BlockFilter,_std::allocator<BlockFilter>_> filters;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 local_1e0 [8];
  uint256 *local_1d8;
  char *local_1d0;
  assertion_result local_1c8;
  uint256 *local_1b0;
  assertion_result local_1a8;
  uint256 **local_190;
  undefined1 local_188 [20];
  uint32_t uStack_174;
  uint256 **local_170;
  undefined1 local_168 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> sStack_160;
  uchar uStack_150;
  uchar uStack_14f;
  uchar uStack_14e;
  uchar uStack_14d;
  uchar uStack_14c;
  uchar uStack_14b;
  uchar uStack_14a;
  uchar uStack_149;
  undefined1 local_148 [17];
  uchar uStack_137;
  uchar uStack_136;
  uchar uStack_135;
  uchar uStack_134;
  uchar uStack_133;
  uchar uStack_132;
  uchar uStack_131;
  uchar uStack_130;
  uchar uStack_12f;
  uchar uStack_12e;
  uchar uStack_12d;
  uchar uStack_12c;
  uchar uStack_12b;
  uchar uStack_12a;
  uchar uStack_129;
  uint256 filter_header;
  BlockFilter filter;
  BlockFilter expected_filter;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  expected_filter.m_filter_type = INVALID;
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  expected_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  filter.m_filter_type = BASIC;
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems._15_4_ =
       filter.m_block_hash.super_base_blob<256U>.m_data._M_elems._15_4_ & 0xffffff00;
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  GCSFilter::GCSFilter(&expected_filter.m_filter,(Params *)&filter);
  bVar7 = ComputeFilter(filter_index->m_filter_type,block_index,&expected_filter,blockman);
  if (bVar7) {
    filter.m_filter_type = INVALID;
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_188._0_8_ = (_func_int **)0x0;
    local_188[8] = false;
    local_188._9_7_ = 0;
    local_188._16_4_ = local_188._16_4_ & 0xffffff00;
    uStack_174 = 1;
    GCSFilter::GCSFilter(&filter.m_filter,(Params *)local_188);
    filter_header.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    filter_header.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_258 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_250 = "";
    local_268 = &boost::unit_test::basic_cstring<char_const>::null;
    local_260 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x2e;
    file.m_begin = (iterator)&local_258;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_268,msg);
    _cVar20 = 0x2eb7ce;
    rVar8.super_class_property<bool>.value =
         (class_property<bool>)BlockFilterIndex::LookupFilter(filter_index,block_index,&filter);
    local_1a8.m_message.px = (element_type *)0x0;
    local_1a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_348._0_8_ = "filter_index.LookupFilter(block_index, filter)";
    local_348._8_8_ = "";
    local_188[8] = 0;
    local_188._0_8_ = &PTR__lazy_ostream_013abc70;
    stack0xfffffffffffffe88 = boost::unit_test::lazy_ostream::inst;
    local_278 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_270 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x0;
    local_170 = (uint256 **)local_348;
    local_1a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)rVar8.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              (&local_1a8,(lazy_ostream *)local_188,1,0,WARN,_cVar20,(size_t)&local_278,0x2e);
    boost::detail::shared_count::~shared_count(&local_1a8.m_message.pn);
    local_288 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_280 = "";
    local_298 = &boost::unit_test::basic_cstring<char_const>::null;
    local_290 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x2f;
    file_00.m_begin = (iterator)&local_288;
    msg_00.m_end = pvVar10;
    msg_00.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_298,
               msg_00);
    _cVar20 = 0x2eb8b7;
    local_1a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         BlockFilterIndex::LookupFilterHeader(filter_index,block_index,&filter_header);
    local_1a8.m_message.px = (element_type *)0x0;
    local_1a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_348._0_8_ = "filter_index.LookupFilterHeader(block_index, filter_header)";
    local_348._8_8_ = "";
    local_188[8] = 0;
    local_188._0_8_ = &PTR__lazy_ostream_013abc70;
    stack0xfffffffffffffe88 = boost::unit_test::lazy_ostream::inst;
    local_2a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_2a0 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x0;
    local_170 = (uint256 **)local_348;
    boost::test_tools::tt_detail::report_assertion
              (&local_1a8,(lazy_ostream *)local_188,1,0,WARN,_cVar20,(size_t)&local_2a8,0x2f);
    boost::detail::shared_count::~shared_count(&local_1a8.m_message.pn);
    local_2b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_2b0 = "";
    local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x30;
    file_01.m_begin = (iterator)&local_2b8;
    msg_01.m_end = pvVar10;
    msg_01.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2c8,
               msg_01);
    _cVar20 = 0x2eb99c;
    local_1a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         BlockFilterIndex::LookupFilterRange(filter_index,block_index->nHeight,block_index,&filters)
    ;
    local_1a8.m_message.px = (element_type *)0x0;
    local_1a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_348._0_8_ = "filter_index.LookupFilterRange(block_index->nHeight, block_index, filters)";
    local_348._8_8_ = "";
    local_188[8] = 0;
    local_188._0_8_ = &PTR__lazy_ostream_013abc70;
    stack0xfffffffffffffe88 = boost::unit_test::lazy_ostream::inst;
    local_2d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_2d0 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x0;
    local_170 = (uint256 **)local_348;
    boost::test_tools::tt_detail::report_assertion
              (&local_1a8,(lazy_ostream *)local_188,1,0,WARN,_cVar20,(size_t)&local_2d8,0x30);
    boost::detail::shared_count::~shared_count(&local_1a8.m_message.pn);
    local_2e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_2e0 = "";
    local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x32;
    file_02.m_begin = (iterator)&local_2e8;
    msg_02.m_end = pvVar10;
    msg_02.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2f8,
               msg_02);
    _cVar20 = 0x2eba81;
    local_1a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         BlockFilterIndex::LookupFilterHashRange
                   (filter_index,block_index->nHeight,block_index,&filter_hashes);
    local_1a8.m_message.px = (element_type *)0x0;
    local_1a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_348._0_8_ =
         "filter_index.LookupFilterHashRange(block_index->nHeight, block_index, filter_hashes)";
    local_348._8_8_ = "";
    local_188[8] = 0;
    local_188._0_8_ = &PTR__lazy_ostream_013abc70;
    stack0xfffffffffffffe88 = boost::unit_test::lazy_ostream::inst;
    local_308 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_300 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x0;
    local_170 = (uint256 **)local_348;
    boost::test_tools::tt_detail::report_assertion
              (&local_1a8,(lazy_ostream *)local_188,1,0,WARN,_cVar20,(size_t)&local_308,0x32);
    boost::detail::shared_count::~shared_count(&local_1a8.m_message.pn);
    local_318 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_310 = "";
    local_328 = &boost::unit_test::basic_cstring<char_const>::null;
    local_320 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x34;
    file_03.m_begin = (iterator)&local_318;
    msg_03.m_end = pvVar10;
    msg_03.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_328,
               msg_03);
    local_348._8_8_ = local_348._8_8_ & 0xffffffffffffff00;
    local_348._0_8_ = &PTR__lazy_ostream_013abb30;
    local_338 = boost::unit_test::lazy_ostream::inst;
    local_330 = "";
    local_1b0 = (uint256 *)
                (((long)filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
    local_1c8._0_8_ = &local_1b0;
    local_1d8 = (uint256 *)local_1e0;
    local_148[0] = (class_property<bool>)
                   ((long)filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>.
                          _M_impl.super__Vector_impl_data._M_start == 0x68);
    local_1e0[0] = '\x01';
    local_1e0[1] = '\0';
    local_1e0[2] = '\0';
    local_1e0[3] = '\0';
    local_148[8] = '\0';
    local_148[9] = '\0';
    local_148[10] = '\0';
    local_148[0xb] = '\0';
    local_148[0xc] = '\0';
    local_148[0xd] = '\0';
    local_148[0xe] = '\0';
    local_148[0xf] = '\0';
    local_148[0x10] = '\0';
    uStack_137 = '\0';
    uStack_136 = '\0';
    uStack_135 = '\0';
    uStack_134 = '\0';
    uStack_133 = '\0';
    uStack_132 = '\0';
    uStack_131 = '\0';
    local_168 = (undefined1  [8])0xe6340a;
    sStack_160.px = (element_type *)0xe6347a;
    local_188[8] = 0;
    local_188._0_8_ = &PTR__lazy_ostream_013abb70;
    stack0xfffffffffffffe88 = boost::unit_test::lazy_ostream::inst;
    local_1a8.m_message.px = (element_type *)(local_1a8.m_message._1_8_ << 8);
    local_1a8._0_8_ = &PTR__lazy_ostream_013abbb0;
    local_1a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x2;
    local_190 = &local_1d8;
    local_170 = (uint256 **)&local_1c8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_148,(lazy_ostream *)local_348,1,2,REQUIRE,0xe63a33,
               (size_t)local_168,0x34,local_188,"1U",&local_1a8);
    boost::detail::shared_count::~shared_count((shared_count *)(local_148 + 0x10));
    local_358 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_350 = "";
    local_368 = &boost::unit_test::basic_cstring<char_const>::null;
    local_360 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x35;
    file_04.m_begin = (iterator)&local_358;
    msg_04.m_end = pvVar10;
    msg_04.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_368,
               msg_04);
    local_348._8_8_ = local_348._8_8_ & 0xffffffffffffff00;
    local_348._0_8_ = &PTR__lazy_ostream_013abb30;
    local_338 = boost::unit_test::lazy_ostream::inst;
    local_330 = "";
    local_1b0 = (uint256 *)
                ((long)filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start >> 5);
    local_148[0] = (class_property<bool>)
                   ((long)filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start == 0x20);
    local_1e0._0_4_ = 1;
    local_148[8] = '\0';
    local_148[9] = '\0';
    local_148[10] = '\0';
    local_148[0xb] = '\0';
    local_148[0xc] = '\0';
    local_148[0xd] = '\0';
    local_148[0xe] = '\0';
    local_148[0xf] = '\0';
    local_148[0x10] = '\0';
    uStack_137 = '\0';
    uStack_136 = '\0';
    uStack_135 = '\0';
    uStack_134 = '\0';
    uStack_133 = '\0';
    uStack_132 = '\0';
    uStack_131 = '\0';
    local_168 = (undefined1  [8])0xe6340a;
    sStack_160.px = (element_type *)0xe6347a;
    local_1c8._0_8_ = &local_1b0;
    local_188[8] = 0;
    local_188._0_8_ = &PTR__lazy_ostream_013abb70;
    stack0xfffffffffffffe88 = boost::unit_test::lazy_ostream::inst;
    local_1d8 = (uint256 *)local_1e0;
    local_1a8.m_message.px = (element_type *)(local_1a8.m_message._1_8_ << 8);
    local_1a8._0_8_ = &PTR__lazy_ostream_013abbb0;
    local_1a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x2;
    local_190 = &local_1d8;
    local_170 = (uint256 **)&local_1c8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_148,(lazy_ostream *)local_348,1,2,REQUIRE,0xe63a54,
               (size_t)local_168,0x35,local_188,"1U",&local_1a8);
    boost::detail::shared_count::~shared_count((shared_count *)(local_148 + 0x10));
    local_378 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_370 = "";
    local_388 = &boost::unit_test::basic_cstring<char_const>::null;
    local_380 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x37;
    file_05.m_begin = (iterator)&local_378;
    msg_05.m_end = pvVar10;
    msg_05.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_388,
               msg_05);
    local_348._8_8_ = local_348._8_8_ & 0xffffffffffffff00;
    local_348._0_8_ = &PTR__lazy_ostream_013abb30;
    local_338 = boost::unit_test::lazy_ostream::inst;
    local_330 = "";
    BlockFilter::GetHash((uint256 *)local_148,&filter);
    BlockFilter::GetHash((uint256 *)local_168,&expected_filter);
    auVar17[0] = -(local_168[0] == local_148[0]);
    auVar17[1] = -(local_168[1] == local_148[1]);
    auVar17[2] = -(local_168[2] == local_148[2]);
    auVar17[3] = -(local_168[3] == local_148[3]);
    auVar17[4] = -(local_168[4] == local_148[4]);
    auVar17[5] = -(local_168[5] == local_148[5]);
    auVar17[6] = -(local_168[6] == local_148[6]);
    auVar17[7] = -(local_168[7] == local_148[7]);
    auVar17[8] = -((uchar)sStack_160.px == local_148[8]);
    auVar17[9] = -(sStack_160.px._1_1_ == local_148[9]);
    auVar17[10] = -(sStack_160.px._2_1_ == local_148[10]);
    auVar17[0xb] = -(sStack_160.px._3_1_ == local_148[0xb]);
    auVar17[0xc] = -(sStack_160.px._4_1_ == local_148[0xc]);
    auVar17[0xd] = -(sStack_160.px._5_1_ == local_148[0xd]);
    auVar17[0xe] = -(sStack_160.px._6_1_ == local_148[0xe]);
    auVar17[0xf] = -(sStack_160.px._7_1_ == local_148[0xf]);
    auVar12[0] = -((uchar)sStack_160.pn.pi_ == local_148[0x10]);
    auVar12[1] = -(sStack_160.pn.pi_._1_1_ == uStack_137);
    auVar12[2] = -(sStack_160.pn.pi_._2_1_ == uStack_136);
    auVar12[3] = -(sStack_160.pn.pi_._3_1_ == uStack_135);
    auVar12[4] = -(sStack_160.pn.pi_._4_1_ == uStack_134);
    auVar12[5] = -(sStack_160.pn.pi_._5_1_ == uStack_133);
    auVar12[6] = -(sStack_160.pn.pi_._6_1_ == uStack_132);
    auVar12[7] = -(sStack_160.pn.pi_._7_1_ == uStack_131);
    auVar12[8] = -(uStack_150 == uStack_130);
    auVar12[9] = -(uStack_14f == uStack_12f);
    auVar12[10] = -(uStack_14e == uStack_12e);
    auVar12[0xb] = -(uStack_14d == uStack_12d);
    auVar12[0xc] = -(uStack_14c == uStack_12c);
    auVar12[0xd] = -(uStack_14b == uStack_12b);
    auVar12[0xe] = -(uStack_14a == uStack_12a);
    auVar12[0xf] = -(uStack_149 == uStack_129);
    auVar12 = auVar12 & auVar17;
    local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff);
    local_1c8.m_message.px = (element_type *)0x0;
    local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1d8 = (uint256 *)0xe6340a;
    local_1d0 = "";
    local_188[8] = 0;
    local_188._0_8_ = &PTR__lazy_ostream_013ac618;
    stack0xfffffffffffffe88 = boost::unit_test::lazy_ostream::inst;
    local_170 = &local_1b0;
    local_1a8.m_message.px = (element_type *)(local_1a8.m_message._1_8_ << 8);
    local_1a8._0_8_ = &PTR__lazy_ostream_013ac618;
    local_1a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_190 = (uint256 **)local_1e0;
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x2;
    local_1e0 = (undefined1  [8])local_168;
    local_1b0 = (uint256 *)local_148;
    boost::test_tools::tt_detail::report_assertion
              (&local_1c8,(lazy_ostream *)local_348,1,2,REQUIRE,0xe63c5e,(size_t)&local_1d8,0x37,
               local_188,"expected_filter.GetHash()",&local_1a8);
    boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
    local_398 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_390 = "";
    local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x38;
    file_06.m_begin = (iterator)&local_398;
    msg_06.m_end = pvVar10;
    msg_06.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3a8,
               msg_06);
    local_348._8_8_ = local_348._8_8_ & 0xffffffffffffff00;
    local_348._0_8_ = &PTR__lazy_ostream_013abb30;
    local_338 = boost::unit_test::lazy_ostream::inst;
    local_330 = "";
    BlockFilter::ComputeHeader((uint256 *)local_148,&expected_filter,last_header);
    auVar16[0] = -(local_148[0x10] == filter_header.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar16[1] = -(uStack_137 == filter_header.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar16[2] = -(uStack_136 == filter_header.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar16[3] = -(uStack_135 == filter_header.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar16[4] = -(uStack_134 == filter_header.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar16[5] = -(uStack_133 == filter_header.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar16[6] = -(uStack_132 == filter_header.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar16[7] = -(uStack_131 == filter_header.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar16[8] = -(uStack_130 == filter_header.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar16[9] = -(uStack_12f == filter_header.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar16[10] = -(uStack_12e == filter_header.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar16[0xb] = -(uStack_12d == filter_header.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar16[0xc] = -(uStack_12c == filter_header.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar16[0xd] = -(uStack_12b == filter_header.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar16[0xe] = -(uStack_12a == filter_header.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar16[0xf] = -(uStack_129 == filter_header.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar13[0] = -(local_148[0] ==
                  (class_property<bool>)filter_header.super_base_blob<256U>.m_data._M_elems[0]);
    auVar13[1] = -(local_148[1] == filter_header.super_base_blob<256U>.m_data._M_elems[1]);
    auVar13[2] = -(local_148[2] == filter_header.super_base_blob<256U>.m_data._M_elems[2]);
    auVar13[3] = -(local_148[3] == filter_header.super_base_blob<256U>.m_data._M_elems[3]);
    auVar13[4] = -(local_148[4] == filter_header.super_base_blob<256U>.m_data._M_elems[4]);
    auVar13[5] = -(local_148[5] == filter_header.super_base_blob<256U>.m_data._M_elems[5]);
    auVar13[6] = -(local_148[6] == filter_header.super_base_blob<256U>.m_data._M_elems[6]);
    auVar13[7] = -(local_148[7] == filter_header.super_base_blob<256U>.m_data._M_elems[7]);
    auVar13[8] = -(local_148[8] == filter_header.super_base_blob<256U>.m_data._M_elems[8]);
    auVar13[9] = -(local_148[9] == filter_header.super_base_blob<256U>.m_data._M_elems[9]);
    auVar13[10] = -(local_148[10] == filter_header.super_base_blob<256U>.m_data._M_elems[10]);
    auVar13[0xb] = -(local_148[0xb] == filter_header.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar13[0xc] = -(local_148[0xc] == filter_header.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar13[0xd] = -(local_148[0xd] == filter_header.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar13[0xe] = -(local_148[0xe] == filter_header.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar13[0xf] = -(local_148[0xf] == filter_header.super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar13 = auVar13 & auVar16;
    local_168[0] = (class_property<bool>)
                   (class_property<bool>)
                   ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff);
    sStack_160.px = (element_type *)0x0;
    sStack_160.pn.pi_ = (sp_counted_base *)0x0;
    local_1c8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_1c8.m_message.px = (element_type *)0xe6347a;
    local_1d8 = &filter_header;
    local_188[8] = 0;
    local_188._0_8_ = &PTR__lazy_ostream_013ac618;
    stack0xfffffffffffffe88 = boost::unit_test::lazy_ostream::inst;
    local_1a8.m_message.px = (element_type *)(local_1a8.m_message._1_8_ << 8);
    local_1a8._0_8_ = &PTR__lazy_ostream_013ac618;
    local_1a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_190 = &local_1b0;
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x2;
    local_1b0 = (uint256 *)local_148;
    local_170 = &local_1d8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_168,(lazy_ostream *)local_348,1,2,REQUIRE,0xe63c6f,
               (size_t)&local_1c8,0x38,local_188,"expected_filter.ComputeHeader(last_header)",
               &local_1a8);
    boost::detail::shared_count::~shared_count(&sStack_160.pn);
    local_3b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_3b0 = "";
    local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x39;
    file_07.m_begin = (iterator)&local_3b8;
    msg_07.m_end = pvVar10;
    msg_07.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3c8,
               msg_07);
    local_348._8_8_ = local_348._8_8_ & 0xffffffffffffff00;
    local_348._0_8_ = &PTR__lazy_ostream_013abb30;
    local_338 = boost::unit_test::lazy_ostream::inst;
    local_330 = "";
    BlockFilter::GetHash
              ((uint256 *)local_148,
               filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
               super__Vector_impl_data._M_start);
    BlockFilter::GetHash((uint256 *)local_168,&expected_filter);
    auVar18[0] = -(local_168[0] == local_148[0]);
    auVar18[1] = -(local_168[1] == local_148[1]);
    auVar18[2] = -(local_168[2] == local_148[2]);
    auVar18[3] = -(local_168[3] == local_148[3]);
    auVar18[4] = -(local_168[4] == local_148[4]);
    auVar18[5] = -(local_168[5] == local_148[5]);
    auVar18[6] = -(local_168[6] == local_148[6]);
    auVar18[7] = -(local_168[7] == local_148[7]);
    auVar18[8] = -((uchar)sStack_160.px == local_148[8]);
    auVar18[9] = -(sStack_160.px._1_1_ == local_148[9]);
    auVar18[10] = -(sStack_160.px._2_1_ == local_148[10]);
    auVar18[0xb] = -(sStack_160.px._3_1_ == local_148[0xb]);
    auVar18[0xc] = -(sStack_160.px._4_1_ == local_148[0xc]);
    auVar18[0xd] = -(sStack_160.px._5_1_ == local_148[0xd]);
    auVar18[0xe] = -(sStack_160.px._6_1_ == local_148[0xe]);
    auVar18[0xf] = -(sStack_160.px._7_1_ == local_148[0xf]);
    auVar14[0] = -((uchar)sStack_160.pn.pi_ == local_148[0x10]);
    auVar14[1] = -(sStack_160.pn.pi_._1_1_ == uStack_137);
    auVar14[2] = -(sStack_160.pn.pi_._2_1_ == uStack_136);
    auVar14[3] = -(sStack_160.pn.pi_._3_1_ == uStack_135);
    auVar14[4] = -(sStack_160.pn.pi_._4_1_ == uStack_134);
    auVar14[5] = -(sStack_160.pn.pi_._5_1_ == uStack_133);
    auVar14[6] = -(sStack_160.pn.pi_._6_1_ == uStack_132);
    auVar14[7] = -(sStack_160.pn.pi_._7_1_ == uStack_131);
    auVar14[8] = -(uStack_150 == uStack_130);
    auVar14[9] = -(uStack_14f == uStack_12f);
    auVar14[10] = -(uStack_14e == uStack_12e);
    auVar14[0xb] = -(uStack_14d == uStack_12d);
    auVar14[0xc] = -(uStack_14c == uStack_12c);
    auVar14[0xd] = -(uStack_14b == uStack_12b);
    auVar14[0xe] = -(uStack_14a == uStack_12a);
    auVar14[0xf] = -(uStack_149 == uStack_129);
    auVar14 = auVar14 & auVar18;
    local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff);
    local_1c8.m_message.px = (element_type *)0x0;
    local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1d8 = (uint256 *)0xe6340a;
    local_1d0 = "";
    local_188[8] = 0;
    local_188._0_8_ = &PTR__lazy_ostream_013ac618;
    stack0xfffffffffffffe88 = boost::unit_test::lazy_ostream::inst;
    local_170 = &local_1b0;
    local_1a8.m_message.px = (element_type *)(local_1a8.m_message._1_8_ << 8);
    local_1a8._0_8_ = &PTR__lazy_ostream_013ac618;
    local_1a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_190 = (uint256 **)local_1e0;
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x2;
    local_1e0 = (undefined1  [8])local_168;
    local_1b0 = (uint256 *)local_148;
    boost::test_tools::tt_detail::report_assertion
              (&local_1c8,(lazy_ostream *)local_348,1,2,REQUIRE,0xe63ca8,(size_t)&local_1d8,0x39,
               local_188,"expected_filter.GetHash()",&local_1a8);
    boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
    local_3d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_3d0 = "";
    local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0x3a;
    file_08.m_begin = (iterator)&local_3d8;
    msg_08.m_end = pvVar10;
    msg_08.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3e8,
               msg_08);
    local_348._8_8_ = local_348._8_8_ & 0xffffffffffffff00;
    local_348._0_8_ = &PTR__lazy_ostream_013abb30;
    local_338 = boost::unit_test::lazy_ostream::inst;
    local_330 = "";
    puVar4 = filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start;
    BlockFilter::GetHash((uint256 *)local_148,&expected_filter);
    auVar12 = *(undefined1 (*) [16])((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
    auVar19[0] = -(local_148[0] ==
                  (class_property<bool>)(puVar4->super_base_blob<256U>).m_data._M_elems[0]);
    auVar19[1] = -(local_148[1] == (puVar4->super_base_blob<256U>).m_data._M_elems[1]);
    auVar19[2] = -(local_148[2] == (puVar4->super_base_blob<256U>).m_data._M_elems[2]);
    auVar19[3] = -(local_148[3] == (puVar4->super_base_blob<256U>).m_data._M_elems[3]);
    auVar19[4] = -(local_148[4] == (puVar4->super_base_blob<256U>).m_data._M_elems[4]);
    auVar19[5] = -(local_148[5] == (puVar4->super_base_blob<256U>).m_data._M_elems[5]);
    auVar19[6] = -(local_148[6] == (puVar4->super_base_blob<256U>).m_data._M_elems[6]);
    auVar19[7] = -(local_148[7] == (puVar4->super_base_blob<256U>).m_data._M_elems[7]);
    auVar19[8] = -(local_148[8] == (puVar4->super_base_blob<256U>).m_data._M_elems[8]);
    auVar19[9] = -(local_148[9] == (puVar4->super_base_blob<256U>).m_data._M_elems[9]);
    auVar19[10] = -(local_148[10] == (puVar4->super_base_blob<256U>).m_data._M_elems[10]);
    auVar19[0xb] = -(local_148[0xb] == (puVar4->super_base_blob<256U>).m_data._M_elems[0xb]);
    auVar19[0xc] = -(local_148[0xc] == (puVar4->super_base_blob<256U>).m_data._M_elems[0xc]);
    auVar19[0xd] = -(local_148[0xd] == (puVar4->super_base_blob<256U>).m_data._M_elems[0xd]);
    auVar19[0xe] = -(local_148[0xe] == (puVar4->super_base_blob<256U>).m_data._M_elems[0xe]);
    auVar19[0xf] = -(local_148[0xf] == (puVar4->super_base_blob<256U>).m_data._M_elems[0xf]);
    auVar15[0] = -(local_148[0x10] == auVar12[0]);
    auVar15[1] = -(uStack_137 == auVar12[1]);
    auVar15[2] = -(uStack_136 == auVar12[2]);
    auVar15[3] = -(uStack_135 == auVar12[3]);
    auVar15[4] = -(uStack_134 == auVar12[4]);
    auVar15[5] = -(uStack_133 == auVar12[5]);
    auVar15[6] = -(uStack_132 == auVar12[6]);
    auVar15[7] = -(uStack_131 == auVar12[7]);
    auVar15[8] = -(uStack_130 == auVar12[8]);
    auVar15[9] = -(uStack_12f == auVar12[9]);
    auVar15[10] = -(uStack_12e == auVar12[10]);
    auVar15[0xb] = -(uStack_12d == auVar12[0xb]);
    auVar15[0xc] = -(uStack_12c == auVar12[0xc]);
    auVar15[0xd] = -(uStack_12b == auVar12[0xd]);
    auVar15[0xe] = -(uStack_12a == auVar12[0xe]);
    auVar15[0xf] = -(uStack_129 == auVar12[0xf]);
    auVar15 = auVar15 & auVar19;
    local_168[0] = (class_property<bool>)
                   (class_property<bool>)
                   ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff);
    sStack_160.px = (element_type *)0x0;
    sStack_160.pn.pi_ = (sp_counted_base *)0x0;
    local_1c8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_1c8.m_message.px = (element_type *)0xe6347a;
    local_1d8 = puVar4;
    local_188[8] = 0;
    local_188._0_8_ = &PTR__lazy_ostream_013ac618;
    stack0xfffffffffffffe88 = boost::unit_test::lazy_ostream::inst;
    local_1a8.m_message.px = (element_type *)(local_1a8.m_message._1_8_ << 8);
    local_1a8._0_8_ = &PTR__lazy_ostream_013ac618;
    local_1a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_190 = &local_1b0;
    local_1b0 = (uint256 *)local_148;
    local_170 = &local_1d8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_168,(lazy_ostream *)local_348,1,2,REQUIRE,0xe63cbd,
               (size_t)&local_1c8,0x3a,local_188,"expected_filter.GetHash()",&local_1a8);
    boost::detail::shared_count::~shared_count(&sStack_160.pn);
    pBVar5 = filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar6 = filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pBVar11 = filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        puVar2 = (pBVar11->m_filter).m_encoded.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar2 != (pointer)0x0) {
          operator_delete(puVar2,(long)(pBVar11->m_filter).m_encoded.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)puVar2);
        }
        pBVar11 = pBVar11 + 1;
      } while (pBVar11 != pBVar6);
      filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
      super__Vector_impl_data._M_finish = pBVar5;
    }
    puVar4 = filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start) {
      filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish =
           filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    *(undefined8 *)((last_header->super_base_blob<256U>).m_data._M_elems + 0x10) =
         filter_header.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)((last_header->super_base_blob<256U>).m_data._M_elems + 0x18) =
         filter_header.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)(last_header->super_base_blob<256U>).m_data._M_elems =
         filter_header.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)((last_header->super_base_blob<256U>).m_data._M_elems + 8) =
         filter_header.super_base_blob<256U>.m_data._M_elems._8_8_;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4,(long)filter_hashes.
                                   super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)puVar4);
    }
    std::vector<BlockFilter,_std::allocator<BlockFilter>_>::~vector(&filters);
    uVar3._4_1_ = filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13];
    uVar3._5_1_ = filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14];
    uVar3._6_1_ = filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15];
    uVar3._7_1_ = filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16];
    uVar3._0_1_ = filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf];
    uVar3._1_1_ = filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10];
    uVar3._2_1_ = filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11];
    uVar3._3_1_ = filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12];
    if (filter.m_filter.m_encoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(filter.m_filter.m_encoded.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)filter.m_filter.m_encoded.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)filter.m_filter.m_encoded.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      uVar3._4_1_ = filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13];
      uVar3._5_1_ = filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14];
      uVar3._6_1_ = filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15];
      uVar3._7_1_ = filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16];
      uVar3._0_1_ = filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf];
      uVar3._1_1_ = filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10];
      uVar3._2_1_ = filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11];
      uVar3._3_1_ = filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12];
    }
  }
  else {
    local_1f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_1e8 = "";
    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar20 = 0x2ec5ea;
    file_09.m_end = (iterator)0x25;
    file_09.m_begin = (iterator)&local_1f0;
    msg_09.m_end = in_R9;
    msg_09.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_200,
               msg_09);
    local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffffffffff00;
    local_1a8.m_message.px = (element_type *)0x0;
    local_1a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems._15_8_ = local_188;
    local_188[8] = 0;
    local_188._0_8_ = &PTR__lazy_ostream_013ac888;
    stack0xfffffffffffffe88 = boost::unit_test::lazy_ostream::inst;
    local_170 = (uint256 **)0xe63c36;
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems._23_8_ = &block_index->nHeight;
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    filter.m_filter_type = 0x48;
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = 200;
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = ':';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\x01';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    filter.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_210 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
    ;
    local_208 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_1a8,(lazy_ostream *)&filter,1,1,WARN,_cVar20,(size_t)&local_210,0x25);
    boost::detail::shared_count::~shared_count(&local_1a8.m_message.pn);
    uVar3 = filter.m_block_hash.super_base_blob<256U>.m_data._M_elems._15_8_;
  }
  filter.m_block_hash.super_base_blob<256U>.m_data._M_elems._15_8_ = uVar3;
  if (expected_filter.m_filter.m_encoded.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(expected_filter.m_filter.m_encoded.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)expected_filter.m_filter.m_encoded.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)expected_filter.m_filter.m_encoded.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return SUB81(*(long *)(in_FS_OFFSET + 0x28),0);
}

Assistant:

static bool CheckFilterLookups(BlockFilterIndex& filter_index, const CBlockIndex* block_index,
                               uint256& last_header, const BlockManager& blockman)
{
    BlockFilter expected_filter;
    if (!ComputeFilter(filter_index.GetFilterType(), *block_index, expected_filter, blockman)) {
        BOOST_ERROR("ComputeFilter failed on block " << block_index->nHeight);
        return false;
    }

    BlockFilter filter;
    uint256 filter_header;
    std::vector<BlockFilter> filters;
    std::vector<uint256> filter_hashes;

    BOOST_CHECK(filter_index.LookupFilter(block_index, filter));
    BOOST_CHECK(filter_index.LookupFilterHeader(block_index, filter_header));
    BOOST_CHECK(filter_index.LookupFilterRange(block_index->nHeight, block_index, filters));
    BOOST_CHECK(filter_index.LookupFilterHashRange(block_index->nHeight, block_index,
                                                   filter_hashes));

    BOOST_CHECK_EQUAL(filters.size(), 1U);
    BOOST_CHECK_EQUAL(filter_hashes.size(), 1U);

    BOOST_CHECK_EQUAL(filter.GetHash(), expected_filter.GetHash());
    BOOST_CHECK_EQUAL(filter_header, expected_filter.ComputeHeader(last_header));
    BOOST_CHECK_EQUAL(filters[0].GetHash(), expected_filter.GetHash());
    BOOST_CHECK_EQUAL(filter_hashes[0], expected_filter.GetHash());

    filters.clear();
    filter_hashes.clear();
    last_header = filter_header;
    return true;
}